

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuEvent>::emplace<QDBusMenuEvent_const&>
          (QMovableArrayOps<QDBusMenuEvent> *this,qsizetype i,QDBusMenuEvent *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  char16_t *in_RSI;
  QDBusMenuEvent *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QDBusMenuEvent tmp;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6e;
  byte bVar6;
  QDBusMenuEvent *this_00;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QDBusMenuEvent>::needsDetach
                    ((QArrayDataPointer<QDBusMenuEvent> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (in_RDI->m_eventId).d.ptr) &&
       (qVar3 = QArrayDataPointer<QDBusMenuEvent>::freeSpaceAtEnd
                          ((QArrayDataPointer<QDBusMenuEvent> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff6e,
                                                   CONCAT24(in_stack_ffffffffffffff6c,
                                                            in_stack_ffffffffffffff68)))),
       qVar3 != 0)) {
      QArrayDataPointer<QDBusMenuEvent>::end((QArrayDataPointer<QDBusMenuEvent> *)in_RDI);
      QDBusMenuEvent::QDBusMenuEvent
                (in_RDI,(QDBusMenuEvent *)
                        CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      (in_RDI->m_eventId).d.ptr = (char16_t *)((long)(in_RDI->m_eventId).d.ptr + 1);
      goto LAB_00b0ec78;
    }
    if ((in_RSI == (char16_t *)0x0) &&
       (qVar3 = QArrayDataPointer<QDBusMenuEvent>::freeSpaceAtBegin
                          ((QArrayDataPointer<QDBusMenuEvent> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff6e,
                                                   CONCAT24(in_stack_ffffffffffffff6c,
                                                            in_stack_ffffffffffffff68)))),
       qVar3 != 0)) {
      QArrayDataPointer<QDBusMenuEvent>::begin((QArrayDataPointer<QDBusMenuEvent> *)0xb0eb4a);
      QDBusMenuEvent::QDBusMenuEvent
                (in_RDI,(QDBusMenuEvent *)
                        CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      (in_RDI->m_eventId).d.d = (Data *)&(in_RDI->m_eventId).d.d[-5].super_QArrayData.alloc;
      (in_RDI->m_eventId).d.ptr = (char16_t *)((long)(in_RDI->m_eventId).d.ptr + 1);
      goto LAB_00b0ec78;
    }
  }
  memset(local_50,0xaa,0x48);
  QDBusMenuEvent::QDBusMenuEvent
            (in_RDI,(QDBusMenuEvent *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58))
  ;
  bVar4 = (in_RDI->m_eventId).d.ptr != (char16_t *)0x0;
  uVar5 = bVar4 && in_RSI == (char16_t *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (char16_t *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QDBusMenuEvent>::detachAndGrow
            ((QArrayDataPointer<QDBusMenuEvent> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QDBusMenuEvent **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff6c,uVar2))),
             (QArrayDataPointer<QDBusMenuEvent> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QDBusMenuEvent> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff6c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff58));
    Inserter::insertOne((Inserter *)in_RDI,
                        (QDBusMenuEvent *)CONCAT17(uVar5,in_stack_ffffffffffffff58));
    Inserter::~Inserter((Inserter *)in_RDI);
  }
  else {
    QArrayDataPointer<QDBusMenuEvent>::begin((QArrayDataPointer<QDBusMenuEvent> *)0xb0ec0c);
    QDBusMenuEvent::QDBusMenuEvent
              (in_RDI,(QDBusMenuEvent *)CONCAT17(uVar5,in_stack_ffffffffffffff58));
    (in_RDI->m_eventId).d.d = (Data *)&(in_RDI->m_eventId).d.d[-5].super_QArrayData.alloc;
    (in_RDI->m_eventId).d.ptr = (char16_t *)((long)(in_RDI->m_eventId).d.ptr + 1);
  }
  QDBusMenuEvent::~QDBusMenuEvent(in_RDI);
LAB_00b0ec78:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }